

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
iterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,Literal *query,
          bool retrieveSubstitutions,bool reversed,AbstractingUnifier *args,AbstractionOracle args_1
          ,bool args_2)

{
  long *plVar1;
  Self SVar2;
  char cVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000011;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *p;
  undefined4 in_register_0000008c;
  undefined3 in_stack_00000009;
  bool in_stack_00000010;
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  local_60;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_50;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_40;
  
  plVar1 = *(long **)&(query->super_Term)._functor;
  if (plVar1 == (long *)0x0) {
    cVar3 = '\x01';
  }
  else {
    cVar3 = (**(code **)(*plVar1 + 0x18))();
  }
  if (cVar3 == '\0') {
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node*,Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
              ((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
                *)&local_50,(SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)query
               ,*(Node **)&(query->super_Term)._functor,
               (Literal *)CONCAT71(in_register_00000011,retrieveSubstitutions),reversed,
               SUB81(args,0),(AbstractingUnifier *)CONCAT44(in_register_0000008c,args_1._mode),
               _args_2,in_stack_00000010);
    ::Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              (&local_60,(Lib *)&local_50,p);
    puVar4 = (undefined8 *)
             ::Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    SVar2._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         local_60._iter._p._self._M_t.
         super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         .
         super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
         ._M_head_impl;
    local_60._iter._p._self._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            )0x0;
    *(undefined4 *)(puVar4 + 1) = 0;
    *puVar4 = &PTR__ProxyIterator_00b594d0;
    ((_Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
      *)(puVar4 + 2))->_M_head_impl =
         (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)SVar2._M_t.
            super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            .
            super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
            ._M_head_impl;
    local_40._self._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            )0x0;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)(puVar4 + 1) = 1;
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_40);
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_60);
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_50);
  }
  else {
    ::Lib::
    VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    ::getEmpty();
  }
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
          )(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
            *)this;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }